

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsExecutionServer.cpp
# Opt level: O3

ssize_t __thiscall
xs::MessageBuilder::read(MessageBuilder *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  undefined8 in_RAX;
  ulong uVar2;
  ulong extraout_RAX;
  int iVar4;
  undefined4 in_register_00000034;
  RingBuffer<unsigned_char> *this_00;
  deUint8 *data;
  undefined8 uStack_28;
  pointer puVar3;
  
  this_00 = (RingBuffer<unsigned_char> *)CONCAT44(in_register_00000034,__fd);
  data = (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
  puVar3 = (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uStack_28 = in_RAX;
  if (((ulong)((long)puVar3 - (long)data) < 8) && (iVar4 = this_00->m_numElements, 0 < iVar4)) {
    do {
      iVar1 = this_00->m_back;
      this_00->m_back = (iVar1 + 1) % this_00->m_size;
      this_00->m_numElements = iVar4 + -1;
      uStack_28 = CONCAT17(this_00->m_buffer[iVar1],(undefined7)uStack_28);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&this->m_buffer,(uchar *)((long)&uStack_28 + 7));
      data = (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
      puVar3 = (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (7 < (ulong)((long)puVar3 - (long)data)) {
        if ((long)puVar3 - (long)data == 8) {
          Message::parseHeader(data,8,&this->m_messageType,&this->m_messageSize);
          data = (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
          puVar3 = (this->m_buffer).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        break;
      }
      iVar4 = this_00->m_numElements;
    } while (0 < iVar4);
  }
  uVar2 = (long)puVar3 - (long)data;
  if (7 < uVar2) {
    iVar1 = (int)uVar2;
    iVar4 = (int)this->m_messageSize - iVar1;
    if (this_00->m_numElements < iVar4) {
      iVar4 = this_00->m_numElements;
    }
    if (iVar4 != 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this->m_buffer,(long)iVar4 + (long)iVar1);
      de::RingBuffer<unsigned_char>::popBack
                (this_00,(this->m_buffer).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + iVar1,iVar4);
      uVar2 = extraout_RAX;
    }
  }
  return uVar2;
}

Assistant:

void MessageBuilder::read (ByteBuffer& src)
{
	// Try to get header.
	if (m_buffer.size() < MESSAGE_HEADER_SIZE)
	{
		while (m_buffer.size() < MESSAGE_HEADER_SIZE &&
			   src.getNumElements() > 0)
			m_buffer.push_back(src.popBack());

		DE_ASSERT(m_buffer.size() <= MESSAGE_HEADER_SIZE);

		if (m_buffer.size() == MESSAGE_HEADER_SIZE)
		{
			// Got whole header, parse it.
			Message::parseHeader(&m_buffer[0], (int)m_buffer.size(), m_messageType, m_messageSize);
		}
	}

	if (m_buffer.size() >= MESSAGE_HEADER_SIZE)
	{
		// We have header.
		size_t msgSize			= getMessageSize();
		size_t numBytesLeft		= msgSize - m_buffer.size();
		size_t numToRead		= (size_t)de::min(src.getNumElements(), (int)numBytesLeft);

		if (numToRead > 0)
		{
			int curBufPos = (int)m_buffer.size();
			m_buffer.resize(curBufPos+numToRead);
			src.popBack(&m_buffer[curBufPos], (int)numToRead);
		}
	}
}